

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O2

void mslab_free(mempool *pool,mslab *slab,void *ptr)

{
  uint uVar1;
  size_t *psVar2;
  uint32_t uVar3;
  rlist *prVar4;
  rlist *prVar5;
  rlist *prVar6;
  mslab *pmVar7;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  *(void **)ptr = slab->free_list;
  slab->free_list = ptr;
  uVar3 = slab->nfree;
  uVar1 = uVar3 + 1;
  slab->nfree = uVar1;
  if ((slab->in_hot_slabs == false) && (pool->objcount >> 3 <= uVar1)) {
    prVar6 = (slab->next_in_cold).prev;
    prVar4 = (slab->next_in_cold).next;
    prVar6->next = prVar4;
    prVar4->prev = prVar6;
    (slab->next_in_cold).next = &slab->next_in_cold;
    (slab->next_in_cold).prev = &slab->next_in_cold;
    mslab_tree_insert(&pool->hot_slabs,slab);
    slab->in_hot_slabs = true;
    if (pool->first_hot_slab == (mslab *)0x0 || slab < pool->first_hot_slab) {
      pool->first_hot_slab = slab;
    }
  }
  else if (uVar3 == 0) {
    (slab->next_in_cold).prev = &pool->cold_slabs;
    (slab->next_in_cold).next = (pool->cold_slabs).next;
    (pool->cold_slabs).next = &slab->next_in_cold;
    ((slab->next_in_cold).next)->prev = &slab->next_in_cold;
  }
  else if (uVar1 == pool->objcount) {
    if (pool->first_hot_slab == slab) {
      pmVar7 = mslab_tree_next(&pool->hot_slabs,slab);
      pool->first_hot_slab = pmVar7;
    }
    mslab_tree_remove(&pool->hot_slabs,slab);
    slab->in_hot_slabs = false;
    pmVar7 = pool->spare;
    if (slab < pmVar7) {
      prVar6 = &(pmVar7->slab).next_in_list;
      prVar4 = (pmVar7->slab).next_in_list.prev;
      prVar5 = (pmVar7->slab).next_in_list.next;
      prVar4->next = prVar5;
      prVar5->prev = prVar4;
      (pmVar7->slab).next_in_list.next = prVar6;
      (pmVar7->slab).next_in_list.prev = prVar6;
      psVar2 = &(pool->slabs).stats.total;
      *psVar2 = *psVar2 - (pmVar7->slab).size;
      slab_put_with_order(pool->cache,&pmVar7->slab);
    }
    else if (pmVar7 != (mslab *)0x0) {
      prVar6 = &(slab->slab).next_in_list;
      prVar4 = (slab->slab).next_in_list.prev;
      prVar5 = (slab->slab).next_in_list.next;
      prVar4->next = prVar5;
      prVar5->prev = prVar4;
      (slab->slab).next_in_list.next = prVar6;
      (slab->slab).next_in_list.prev = prVar6;
      psVar2 = &(pool->slabs).stats.total;
      *psVar2 = *psVar2 - (slab->slab).size;
      slab_put_with_order(pool->cache,&slab->slab);
      return;
    }
    pool->spare = slab;
  }
  return;
}

Assistant:

void
mslab_free(struct mempool *pool, struct mslab *slab, void *ptr)
{
	/*
	 * Put object to garbage list.
	 * In case when pool objsize is not aligned sizeof(intptr_t) boundary
	 * we can't use *(void **)ptr = slab->free_list construction,
	 * because ptr has not necessary aligment. memcpy can work
	 * with misaligned address.
	 */
	memcpy(ptr, &slab->free_list, sizeof(void *));
	slab->free_list = ptr;
	VALGRIND_FREELIKE_BLOCK(ptr, 0);
	VALGRIND_MAKE_MEM_DEFINED(ptr, sizeof(void *));

	slab->nfree++;

	if (slab->in_hot_slabs == false &&
	    slab->nfree >= (pool->objcount >> MAX_COLD_FRACTION_LB)) {
		/**
		 * Add this slab to the rbtree which contains
		 * sufficiently fragmented slabs.
		 */
		rlist_del_entry(slab, next_in_cold);
		mslab_tree_insert(&pool->hot_slabs, slab);
		slab->in_hot_slabs = true;
		/*
		 * Update first_hot_slab pointer if the newly
		 * added tree node is the leftmost.
		 */
		if (pool->first_hot_slab == NULL ||
		    mslab_cmp(pool->first_hot_slab, slab) == 1) {
			pool->first_hot_slab = slab;
		}
	} else if (slab->nfree == 1) {
		rlist_add_entry(&pool->cold_slabs, slab, next_in_cold);
	} else if (slab->nfree == pool->objcount) {
		/** Free the slab. */
		if (slab == pool->first_hot_slab) {
			pool->first_hot_slab =
				mslab_tree_next(&pool->hot_slabs, slab);
		}
		mslab_tree_remove(&pool->hot_slabs, slab);
		slab->in_hot_slabs = false;
		if (pool->spare > slab) {
			mempool_free_spare_slab(pool);
			pool->spare = slab;
		} else if (pool->spare) {
			slab_list_del(&pool->slabs, &slab->slab,
				      next_in_list);
			slab_put_with_order(pool->cache, &slab->slab);
		} else {
			pool->spare = slab;
		}
	}
}